

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
checkOptions(HighsLogOptions *report_log_options,
            vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records)

{
  _func_int **pp_Var1;
  value_type pOVar2;
  uint uVar3;
  uint uVar4;
  OptionRecordInt *pOVar5;
  __type _Var6;
  OptionStatus OVar7;
  size_type sVar8;
  const_reference ppOVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RSI;
  OptionRecordInt *in_RDI;
  OptionRecordString *check_option_3;
  HighsInt check_index_4;
  string *value_pointer_3;
  OptionRecordString *option_3;
  OptionRecordDouble *check_option_2;
  HighsInt check_index_3;
  double *value_pointer_2;
  OptionRecordDouble *option_2;
  OptionRecordInt *check_option_1;
  HighsInt check_index_2;
  HighsInt *value_pointer_1;
  OptionRecordInt *option_1;
  OptionRecordBool *check_option;
  HighsInt check_index_1;
  bool *value_pointer;
  OptionRecordBool *option;
  string check_name;
  HighsInt check_index;
  HighsOptionType type;
  string name;
  HighsInt index;
  HighsInt num_options;
  bool error_found;
  OptionRecordDouble *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  OptionRecordInt *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  uint local_f4;
  uint local_d4;
  uint local_b4;
  uint local_94;
  string local_70 [32];
  uint local_50;
  HighsOptionType local_4c;
  string local_48 [36];
  uint local_24;
  int local_20;
  byte local_19;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *local_18;
  OptionRecordInt *local_10;
  OptionStatus local_4;
  
  local_19 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar8 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::size(in_RSI);
  local_20 = (int)sVar8;
  for (local_24 = 0; (int)local_24 < local_20; local_24 = local_24 + 1) {
    ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (local_18,(long)(int)local_24);
    std::__cxx11::string::string(local_48,(string *)&(*ppOVar9)->name);
    ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (local_18,(long)(int)local_24);
    local_4c = (*ppOVar9)->type;
    for (local_50 = 0; (int)local_50 < local_20; local_50 = local_50 + 1) {
      if (local_50 != local_24) {
        ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                            (local_18,(long)(int)local_50);
        std::__cxx11::string::string(local_70,(string *)&(*ppOVar9)->name);
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe80,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        pOVar5 = local_10;
        uVar4 = local_24;
        if (_Var6) {
          uVar10 = std::__cxx11::string::c_str();
          uVar3 = local_50;
          uVar11 = std::__cxx11::string::c_str();
          highsLogUser((HighsLogOptions *)pOVar5,kError,
                       "checkOptions: Option %d (\"%s\") has the same name as option %d \"%s\"\n",
                       (ulong)uVar4,uVar10,(ulong)uVar3,uVar11);
          local_19 = 1;
        }
        std::__cxx11::string::~string(local_70);
      }
    }
    if (local_4c == kBool) {
      ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pp_Var1 = (*ppOVar9)[1]._vptr_OptionRecord;
      for (local_94 = 0; (int)local_94 < local_20; local_94 = local_94 + 1) {
        if (((local_94 != local_24) &&
            (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                 (local_18,(long)(int)local_94), (*ppOVar9)->type == kBool)) &&
           (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                (local_18,(long)(int)local_94), pOVar5 = local_10, uVar4 = local_24,
           (*ppOVar9)[1]._vptr_OptionRecord == pp_Var1)) {
          uVar10 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          highsLogUser((HighsLogOptions *)pOVar5,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,(ulong)uVar4,uVar10,(ulong)local_94,uVar11);
          local_19 = 1;
        }
      }
    }
    else if (local_4c == kInt) {
      ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pOVar2 = *ppOVar9;
      OVar7 = checkOption((HighsLogOptions *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
      if (OVar7 != kOk) {
        local_19 = 1;
      }
      pp_Var1 = pOVar2[1]._vptr_OptionRecord;
      for (local_b4 = 0; (int)local_b4 < local_20; local_b4 = local_b4 + 1) {
        if (((local_b4 != local_24) &&
            (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                 (local_18,(long)(int)local_b4), (*ppOVar9)->type == kInt)) &&
           (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                (local_18,(long)(int)local_b4), pOVar5 = local_10, uVar4 = local_24,
           (*ppOVar9)[1]._vptr_OptionRecord == pp_Var1)) {
          uVar10 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          highsLogUser((HighsLogOptions *)pOVar5,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,(ulong)uVar4,uVar10,(ulong)local_b4,uVar11);
          local_19 = 1;
        }
      }
    }
    else if (local_4c == kDouble) {
      ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pOVar2 = *ppOVar9;
      OVar7 = checkOption((HighsLogOptions *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                          in_stack_fffffffffffffe70);
      if (OVar7 != kOk) {
        local_19 = 1;
      }
      pp_Var1 = pOVar2[1]._vptr_OptionRecord;
      for (local_d4 = 0; (int)local_d4 < local_20; local_d4 = local_d4 + 1) {
        if (((local_d4 != local_24) &&
            (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                 (local_18,(long)(int)local_d4), (*ppOVar9)->type == kDouble)) &&
           (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                (local_18,(long)(int)local_d4),
           (*ppOVar9)[1]._vptr_OptionRecord == pp_Var1)) {
          in_stack_fffffffffffffe80 = local_10;
          in_stack_fffffffffffffe8c = local_24;
          uVar10 = std::__cxx11::string::c_str();
          uVar11 = std::__cxx11::string::c_str();
          highsLogUser((HighsLogOptions *)in_stack_fffffffffffffe80,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,(ulong)in_stack_fffffffffffffe8c,uVar10,(ulong)local_d4,uVar11);
          local_19 = 1;
        }
      }
    }
    else if (local_4c == kString) {
      ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (local_18,(long)(int)local_24);
      pp_Var1 = (*ppOVar9)[1]._vptr_OptionRecord;
      for (local_f4 = 0; (int)local_f4 < local_20; local_f4 = local_f4 + 1) {
        if (((local_f4 != local_24) &&
            (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                 (local_18,(long)(int)local_f4), (*ppOVar9)->type == kString)) &&
           (ppOVar9 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                                (local_18,(long)(int)local_f4), pOVar5 = local_10, uVar4 = local_24,
           (*ppOVar9)[1]._vptr_OptionRecord == pp_Var1)) {
          in_stack_fffffffffffffe70 = (OptionRecordDouble *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffe7c = local_f4;
          uVar10 = std::__cxx11::string::c_str();
          highsLogUser((HighsLogOptions *)pOVar5,kError,
                       "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                       ,(ulong)uVar4,in_stack_fffffffffffffe70,(ulong)in_stack_fffffffffffffe7c,
                       uVar10);
          local_19 = 1;
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  if ((local_19 & 1) == 0) {
    highsLogUser((HighsLogOptions *)local_10,kInfo,"checkOptions: Options are OK\n");
    local_4 = kOk;
  }
  else {
    local_4 = kIllegalValue;
  }
  return local_4;
}

Assistant:

OptionStatus checkOptions(const HighsLogOptions& report_log_options,
                          const std::vector<OptionRecord*>& option_records) {
  bool error_found = false;
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    std::string name = option_records[index]->name;
    HighsOptionType type = option_records[index]->type;
    // Check that there are no other options with the same name
    for (HighsInt check_index = 0; check_index < num_options; check_index++) {
      if (check_index == index) continue;
      std::string check_name = option_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkOptions: Option %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as "
                     "option %" HIGHSINT_FORMAT " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsOptionType::kBool) {
      // Check bool option
      OptionRecordBool& option = ((OptionRecordBool*)option_records[index])[0];
      // Check that there are no other options with the same value pointers
      bool* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kBool) {
          OptionRecordBool& check_option =
              ((OptionRecordBool*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kInt) {
      // Check HighsInt option
      OptionRecordInt& option = ((OptionRecordInt*)option_records[index])[0];
      if (checkOption(report_log_options, option) != OptionStatus::kOk)
        error_found = true;
      // Check that there are no other options with the same value pointers
      HighsInt* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kInt) {
          OptionRecordInt& check_option =
              ((OptionRecordInt*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kDouble) {
      // Check double option
      OptionRecordDouble& option =
          ((OptionRecordDouble*)option_records[index])[0];
      if (checkOption(report_log_options, option) != OptionStatus::kOk)
        error_found = true;
      // Check that there are no other options with the same value pointers
      double* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kDouble) {
          OptionRecordDouble& check_option =
              ((OptionRecordDouble*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kString) {
      // Check string option
      OptionRecordString& option =
          ((OptionRecordString*)option_records[index])[0];
      // Check that there are no other options with the same value pointers
      std::string* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kString) {
          OptionRecordString& check_option =
              ((OptionRecordString*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return OptionStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkOptions: Options are OK\n");
  return OptionStatus::kOk;
}